

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# azure_base64.c
# Opt level: O0

STRING_HANDLE Azure_Base64_Encode_Bytes(uchar *source,size_t size)

{
  undefined8 local_20;
  STRING_HANDLE result;
  size_t size_local;
  uchar *source_local;
  
  if (source == (uchar *)0x0) {
    local_20 = (STRING_HANDLE)0x0;
  }
  else if (size == 0) {
    local_20 = STRING_new();
  }
  else {
    local_20 = Base64_Encode_Internal(source,size);
  }
  return local_20;
}

Assistant:

STRING_HANDLE Azure_Base64_Encode_Bytes(const unsigned char* source, size_t size)
{
    STRING_HANDLE result;
    /*Codes_SRS_BASE64_02_001: [If source is NULL then Azure_Base64_Encode_Bytes shall return NULL.] */
    if (source == NULL)
    {
        result = NULL;
    }
    /*Codes_SRS_BASE64_02_002: [If source is not NULL and size is zero, then Azure_Base64_Encode_Bytes shall produce an empty STRING_HANDLE.] */
    else if (size == 0)
    {
        result = STRING_new(); /*empty string*/
    }
    else
    {
        result = Base64_Encode_Internal(source, size);
    }
    return result;
}